

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O0

bool __thiscall
higan::MultiplexEpoll::LoopOnce(MultiplexEpoll *this,int timeout,ChannelList *active_channel_list)

{
  int __epfd;
  LogLevel LVar1;
  epoll_event *__events;
  size_type sVar2;
  size_type sVar3;
  int *piVar4;
  Logger local_250;
  __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_> local_38
  ;
  int local_2c;
  ChannelList *pCStack_28;
  int event_num;
  ChannelList *active_channel_list_local;
  MultiplexEpoll *pMStack_18;
  int timeout_local;
  MultiplexEpoll *this_local;
  
  __epfd = this->epollfd_;
  pCStack_28 = active_channel_list;
  active_channel_list_local._4_4_ = timeout;
  pMStack_18 = this;
  local_38._M_current =
       (epoll_event *)
       std::vector<epoll_event,_std::allocator<epoll_event>_>::begin(&this->epoll_events_);
  __events = (epoll_event *)
             __gnu_cxx::
             __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_>
             ::operator*(&local_38);
  sVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->epoll_events_);
  local_2c = epoll_wait(__epfd,__events,(int)sVar2,active_channel_list_local._4_4_);
  if (local_2c < 1) {
    if (local_2c == 0) {
      return true;
    }
    if ((local_2c < 0) && (piVar4 = __errno_location(), *piVar4 != 4)) {
      LVar1 = Logger::GetLogLevel();
      if ((int)LVar1 < 4) {
        Logger::Logger(&local_250,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/multiplexing/MultiplexEpoll.cpp"
                       ,0x32,"LoopOnce");
        Logger::operator<<(&local_250,"epoll_wait error");
        Logger::~Logger(&local_250);
      }
      piVar4 = __errno_location();
      exit(*piVar4);
    }
  }
  else {
    FillActiveChannelList(this,local_2c,pCStack_28);
    sVar2 = (size_type)local_2c;
    sVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->epoll_events_);
    if (sVar2 == sVar3) {
      sVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->epoll_events_);
      std::vector<epoll_event,_std::allocator<epoll_event>_>::resize
                (&this->epoll_events_,sVar2 << 1);
    }
  }
  return false;
}

Assistant:

bool MultiplexEpoll::LoopOnce(int timeout, MultiplexBase::ChannelList* active_channel_list)
{
	// EPOLLET 模式下如果maxevents太小 导致无法接受全部event 并不会丢弃 只有接收来的才会被丢弃
	int event_num = epoll_wait(epollfd_, &*epoll_events_.begin(), static_cast<int>(epoll_events_.size()), timeout);

	if (event_num > 0)
	{
		FillActiveChannelList(event_num, active_channel_list);
		if(static_cast<size_t>(event_num) == epoll_events_.size())
		{
			epoll_events_.resize(epoll_events_.size() * 2);
		}
	}
	else if (event_num == 0)
	{
		return true;
	}
	else if (event_num < 0)
	{
		if (errno != EINTR)
		{
			LOG_ERROR << "epoll_wait error";
			exit(errno);
		}
	}

	return false;
}